

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.cpp
# Opt level: O0

RTPTime __thiscall jrtplib::RTPSourceData::INF_GetRoundtripTime(RTPSourceData *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  RTCPReceiverReportInfo *this_00;
  double drtt;
  RTPTime RStack_28;
  uint32_t rtt;
  RTPNTPTime local_20;
  RTPNTPTime recvtime;
  RTPSourceData *this_local;
  
  recvtime = (RTPNTPTime)this;
  bVar1 = RTCPReceiverReportInfo::HasInfo(&this->RRinf);
  if (bVar1) {
    uVar2 = RTCPReceiverReportInfo::GetDelaySinceLastSR(&this->RRinf);
    if ((uVar2 == 0) &&
       (uVar2 = RTCPReceiverReportInfo::GetLastSRTimestamp(&this->RRinf), uVar2 == 0)) {
      RTPTime::RTPTime((RTPTime *)&this_local,0,0);
      return (RTPTime)(double)this_local;
    }
    this_00 = &this->RRinf;
    RStack_28 = RTCPReceiverReportInfo::GetReceiveTime(this_00);
    local_20 = RTPTime::GetNTPTime(&stack0xffffffffffffffd8);
    uVar2 = RTPNTPTime::GetMSW(&local_20);
    uVar3 = RTPNTPTime::GetLSW(&local_20);
    uVar4 = RTCPReceiverReportInfo::GetLastSRTimestamp(this_00);
    uVar5 = RTCPReceiverReportInfo::GetDelaySinceLastSR(this_00);
    RTPTime::RTPTime((RTPTime *)&this_local,
                     (double)(((uVar2 << 0x10 | uVar3 >> 0x10) - uVar4) - uVar5) / 65536.0);
  }
  else {
    RTPTime::RTPTime((RTPTime *)&this_local,0,0);
  }
  return (RTPTime)(double)this_local;
}

Assistant:

RTPTime RTPSourceData::INF_GetRoundtripTime() const
{
	if (!RRinf.HasInfo())
		return RTPTime(0,0);
	if (RRinf.GetDelaySinceLastSR() == 0 && RRinf.GetLastSRTimestamp() == 0)
		return RTPTime(0,0);

	RTPNTPTime recvtime = RRinf.GetReceiveTime().GetNTPTime();
	uint32_t rtt = ((recvtime.GetMSW()&0xFFFF)<<16)|((recvtime.GetLSW()>>16)&0xFFFF);
	rtt -= RRinf.GetLastSRTimestamp();
	rtt -= RRinf.GetDelaySinceLastSR();

	double drtt = (((double)rtt)/65536.0);
	return RTPTime(drtt);
}